

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O1

void __thiscall dynet::EGTrainer::update_lookup_params(EGTrainer *this,real gscale,size_t idx)

{
  pointer ppLVar1;
  ParameterCollectionStorage *pPVar2;
  initializer_list<dynet::Tensor_*> __l;
  allocator_type local_55;
  real local_54;
  vector<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_> local_50;
  Tensor *local_38;
  Tensor *local_30;
  pointer local_28;
  Tensor *local_20;
  Tensor *local_18;
  
  local_54 = gscale;
  pPVar2 = ParameterCollection::get_storage((this->super_Trainer).model);
  ppLVar1 = (pPVar2->lookup_params).
            super__Vector_base<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_38 = &ppLVar1[idx]->all_grads;
  local_30 = &ppLVar1[idx]->all_grads;
  local_28 = (this->hlp).
             super__Vector_base<dynet::ShadowLookupParameters,_std::allocator<dynet::ShadowLookupParameters>_>
             ._M_impl.super__Vector_impl_data._M_start + idx;
  local_20 = &this->meg;
  local_18 = &this->zeg;
  __l._M_len = 5;
  __l._M_array = &local_38;
  std::vector<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_>::vector(&local_50,__l,&local_55);
  (*(this->super_Trainer)._vptr_Trainer[5])(local_54,this,&local_50);
  if (local_50.super__Vector_base<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<dynet::Tensor_*,_std::allocator<dynet::Tensor_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void EGTrainer::update_lookup_params(real gscale, size_t idx) {
  auto & p = model->lookup_parameters_list()[idx];
  update_rule(gscale, {&p->all_grads, &p->all_grads, &hlp[idx].all_h, &meg, &zeg});
}